

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintMiter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int fUseLibrary;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"lh"), iVar1 != -1) {
    if ((iVar1 == 0x68) || (iVar1 != 0x6c)) {
      Abc_Print(-2,"usage: print_miter [-h]\n");
      Abc_Print(-2,"\t        prints the status of the miter\n");
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
  }
  if (pNtk_00 == (Abc_Ntk_t *)0x0) {
    Abc_Print(-1,"Empty network.\n");
    return 1;
  }
  iVar1 = Abc_NtkIsStrash(pNtk_00);
  if (iVar1 == 0) {
    Abc_Print(-1,"The network is should be structurally hashed.\n");
    return 1;
  }
  Abc_NtkPrintMiter(pNtk_00);
  return 0;
}

Assistant:

int Abc_CommandPrintMiter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseLibrary;

    extern void Abc_NtkPrintMiter( Abc_Ntk_t * pNtk );

    // set defaults
    fUseLibrary = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLibrary ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is should be structurally hashed.\n" );
        return 1;
    }
    Abc_NtkPrintMiter( pNtk );
    return 0;

usage:
    Abc_Print( -2, "usage: print_miter [-h]\n" );
    Abc_Print( -2, "\t        prints the status of the miter\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}